

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  AP_LOG_LEVEL AVar2;
  int local_68;
  BOOL exit_code_set;
  int exit_code;
  BOOL ip_command_match;
  AP_CTX ctx;
  int rc;
  char **argv_local;
  int argc_local;
  
  ctx.client_command._4_4_ = 0;
  exit_code_set = '\0';
  bVar1 = false;
  if (argv == (char **)0x0) {
    fprintf(_stdout,"Invalid argument: argv\n");
    ctx.client_command._4_4_ = 3;
  }
  else {
    memset(&exit_code,0,0x40);
    ctx.client_command._4_4_ = init((EVP_PKEY_CTX *)&exit_code);
    if (ctx.client_command._4_4_ == 0) {
      AVar2 = ap_log_get_level();
      if (AVar2 == AP_LOG_LEVEL_TRACE) {
        print_environment((AP_CTX *)&exit_code);
      }
      ctx.client_command._4_4_ = parse_config((AP_CTX *)&exit_code,&exit_code_set);
      if (ctx.client_command._4_4_ == 0) {
        if (exit_code_set == '\x01') {
          ctx.client_command._4_4_ = run_command((AP_CTX *)&exit_code,&local_68);
          if (ctx.client_command._4_4_ == 0) {
            bVar1 = true;
          }
        }
        else {
          ap_log(AP_LOG_LEVEL_DENIED_COMMAND,"(%s) Is not allowed to execute command \'%s\'\n",
                 ctx._40_8_,ctx.client_ip);
          fprintf(_stderr,"(%s) Is not allowed to execute command \'%s\'\n",ctx._40_8_,ctx.client_ip
                 );
        }
      }
    }
  }
  if (ctx.client_command._4_4_ == 0) {
    if (bVar1) {
      ctx.client_command._4_4_ = local_68;
    }
  }
  else if ((ctx.client_command._4_4_ == 1) || (ctx.client_command._4_4_ == 2)) {
    ctx.client_command._4_4_ = 0;
  }
  else {
    fprintf(_stderr,
            "authprogs denied your access, please check the log on server (default: \'~/.ssh/authprogs.log\')\n"
           );
  }
  uninit((AP_CTX *)&exit_code);
  return ctx.client_command._4_4_;
}

Assistant:

int main (int argc, char *argv[])
{
	int				rc							= AP_NO_ERROR;
	AP_CTX			ctx;
	BOOL			ip_command_match			= FALSE;
	int				exit_code;
	BOOL			exit_code_set				= FALSE;
	
	if (argv == NULL)
	{
		fprintf (stdout, "Invalid argument: argv\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

	memset (&ctx, 0, sizeof (AP_CTX));

	rc = init (&ctx, argc, argv);
	if (rc != AP_NO_ERROR)
	{	
		goto finish;
	}

	if (ap_log_get_level () == AP_LOG_LEVEL_TRACE)
	{
		print_environment (&ctx);
	}
	
	rc = parse_config (&ctx, &ip_command_match);
	if (rc != AP_NO_ERROR)
	{
		goto finish;
	}
	
	if (ip_command_match == TRUE)
	{
		rc = run_command (&ctx, &exit_code);
		if (rc != AP_NO_ERROR)
		{
			goto finish;
		}

		exit_code_set = TRUE;
	}
	else
	{
		ap_denied ("(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
		fprintf (stderr, "(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
	}
	
finish:
	if (rc == AP_NO_ERROR)
	{
		if (exit_code_set == TRUE)
		{
			rc = exit_code;
		}
	}
	else
	{
		if (rc == AP_ERROR_VERSION || rc == AP_ERROR_HELP)
		{
			rc = AP_NO_ERROR;
		}
		else
		{
			fprintf (stderr, "authprogs denied your access, please check the log on server (default: '~/.ssh/authprogs.log')\n");
		}
	}

	uninit (&ctx);

	return rc;
}